

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.cc
# Opt level: O3

void __thiscall trng::mrg2::mrg2(mrg2 *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *&(this->P).a = P.a;
  iVar1 = (int)((long)s % 0x7fffffff);
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < (long)s % 0x7fffffff) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  return;
}

Assistant:

mrg2::mrg2(unsigned long s, mrg2::parameter_type P) : P{P} { seed(s); }